

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easy.c
# Opt level: O0

CURL_conflict * curl_easy_init(void)

{
  CURLcode CVar1;
  CURL_conflict *local_20;
  Curl_easy *data;
  CURL_conflict *pCStack_10;
  CURLcode result;
  
  if (initialized == 0) {
    CVar1 = curl_global_init(3);
    if (CVar1 != CURLE_OK) {
      return (CURL_conflict *)0x0;
    }
    data._4_4_ = 0;
  }
  CVar1 = Curl_open(&local_20);
  if (CVar1 == CURLE_OK) {
    pCStack_10 = local_20;
  }
  else {
    pCStack_10 = (CURL_conflict *)0x0;
  }
  return pCStack_10;
}

Assistant:

struct Curl_easy *curl_easy_init(void)
{
  CURLcode result;
  struct Curl_easy *data;

  /* Make sure we inited the global SSL stuff */
  if(!initialized) {
    result = curl_global_init(CURL_GLOBAL_DEFAULT);
    if(result) {
      /* something in the global init failed, return nothing */
      DEBUGF(fprintf(stderr, "Error: curl_global_init failed\n"));
      return NULL;
    }
  }

  /* We use curl_open() with undefined URL so far */
  result = Curl_open(&data);
  if(result) {
    DEBUGF(fprintf(stderr, "Error: Curl_open failed\n"));
    return NULL;
  }

  return data;
}